

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matmul.c
# Opt level: O2

MATRIX mat_mul(MATRIX A,MATRIX B)

{
  double *pdVar1;
  MATRIX ppdVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  double dVar10;
  
  ppdVar2 = mat_creat(*(int *)(A + -1),*(int *)((long)B + -4),-1);
  if (ppdVar2 != (MATRIX)0x0) {
    uVar4 = 0;
    uVar3 = (ulong)*(uint *)(A + -1);
    if ((int)*(uint *)(A + -1) < 1) {
      uVar3 = uVar4;
    }
    for (uVar5 = 0; uVar5 != uVar3; uVar5 = uVar5 + 1) {
      uVar6 = (ulong)*(uint *)((long)B + -4);
      if ((int)*(uint *)((long)B + -4) < 1) {
        uVar6 = uVar4;
      }
      for (uVar7 = 0; uVar7 != uVar6; uVar7 = uVar7 + 1) {
        pdVar1 = ppdVar2[uVar5];
        pdVar1[uVar7] = 0.0;
        uVar8 = (ulong)*(uint *)((long)A + -4);
        if ((int)*(uint *)((long)A + -4) < 1) {
          uVar8 = uVar4;
        }
        dVar10 = 0.0;
        for (uVar9 = 0; uVar8 != uVar9; uVar9 = uVar9 + 1) {
          dVar10 = dVar10 + A[uVar5][uVar9] * B[uVar9][uVar7];
          pdVar1[uVar7] = dVar10;
        }
      }
    }
  }
  return ppdVar2;
}

Assistant:

MATRIX mat_mul( MATRIX A, MATRIX B )
{
	int	i, j, k;
	MATRIX	C;

	if ((C = mat_creat( MatRow(A), MatCol(B), UNDEFINED )) == NULL)
		return (NULL);

	for (i=0; i<MatRow(A); i++)
	for (j=0; j<MatCol(B); j++)
	for (k=0, C[i][j]=0.0; k<MatCol(A); k++)
		{
		C[i][j] += A[i][k] * B[k][j];
		}
	return (C);
}